

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Cex.c
# Opt level: O3

Abc_Cex_t * Llb4_Nonlin4TransformCex(Aig_Man_t *pAig,Vec_Ptr_t *vStates,int iCexPo,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Cnf_Dat_t *p;
  sat_solver *s;
  Abc_Cex_t *p_00;
  Vec_Int_t *p_01;
  int *piVar5;
  void *pvVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int local_50;
  
  iVar1 = pAig->nRegs;
  iVar2 = pAig->nObjs[3];
  pAig->nRegs = 0;
  p = Cnf_Derive(pAig,iVar2);
  pAig->nRegs = iVar1;
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p,1,0);
  if (s == (sat_solver *)0x0) {
    puts("Llb4_Nonlin4TransformCex(): Counter-example generation has failed.");
  }
  else {
    iVar1 = sat_solver_simplify(s);
    if (iVar1 != 0) {
      p_00 = Abc_CexAlloc(pAig->nRegs,pAig->nTruePis,vStates->nSize);
      iVar1 = vStates->nSize;
      p_00->iFrame = iVar1 + -1;
      p_00->iPo = -1;
      if (0 < iVar1) {
        local_50 = pAig->nRegs;
        pvVar7 = *vStates->pArray;
        p_01 = (Vec_Int_t *)malloc(0x10);
        iVar2 = 0x10;
        if (0xe < local_50 * 2 - 1U) {
          iVar2 = local_50 * 2;
        }
        p_01->nCap = iVar2;
        if (iVar2 == 0) {
          piVar5 = (int *)0x0;
        }
        else {
          piVar5 = (int *)malloc((long)iVar2 << 2);
        }
        p_01->pArray = piVar5;
        if (iVar1 != 1) {
          lVar8 = 1;
          pvVar6 = pvVar7;
          do {
            pvVar7 = vStates->pArray[lVar8];
            p_01->nSize = 0;
            if (0 < pAig->nRegs) {
              uVar4 = 0;
              do {
                uVar3 = pAig->nTruePis + uVar4;
                if (((int)uVar3 < 0) || (pAig->vCis->nSize <= (int)uVar3)) goto LAB_00835183;
                Vec_IntPush(p_01,(uint)((*(uint *)((long)pvVar6 + (ulong)(uVar4 >> 5) * 4) >>
                                         (uVar4 & 0x1f) & 1) == 0) +
                                 p->pVarNums[*(int *)((long)pAig->vCis->pArray[uVar3] + 0x24)] * 2);
                uVar4 = uVar4 + 1;
              } while ((int)uVar4 < pAig->nRegs);
              if (0 < pAig->nRegs) {
                uVar4 = 0;
                do {
                  uVar3 = pAig->nTruePos + uVar4;
                  if (((int)uVar3 < 0) || (pAig->vCos->nSize <= (int)uVar3)) goto LAB_00835183;
                  Vec_IntPush(p_01,(uint)((*(uint *)((long)pvVar7 + (ulong)(uVar4 >> 5) * 4) >>
                                           (uVar4 & 0x1f) & 1) == 0) +
                                   p->pVarNums[*(int *)((long)pAig->vCos->pArray[uVar3] + 0x24)] * 2
                             );
                  uVar4 = uVar4 + 1;
                } while ((int)uVar4 < pAig->nRegs);
              }
            }
            piVar5 = p_01->pArray;
            iVar1 = sat_solver_solve(s,piVar5,piVar5 + p_01->nSize,0,0,0,0);
            if (iVar1 != 1) {
              printf("Llb4_Nonlin4TransformCex(): There is no transition between state %d and %d.\n"
                     ,(ulong)((int)lVar8 - 1));
              goto LAB_00835001;
            }
            iVar1 = pAig->nTruePis;
            if (0 < iVar1) {
              lVar9 = 0;
              do {
                if (pAig->vCis->nSize <= lVar9) goto LAB_00835183;
                iVar1 = sat_solver_var_value
                                  (s,p->pVarNums[*(int *)((long)pAig->vCis->pArray[lVar9] + 0x24)]);
                if (iVar1 != 0) {
                  iVar1 = local_50 + (int)lVar9;
                  (&p_00[1].iPo)[iVar1 >> 5] =
                       (&p_00[1].iPo)[iVar1 >> 5] | 1 << ((byte)iVar1 & 0x1f);
                }
                lVar9 = lVar9 + 1;
                iVar1 = pAig->nTruePis;
              } while (lVar9 < iVar1);
            }
            local_50 = local_50 + iVar1;
            lVar8 = lVar8 + 1;
            pvVar6 = pvVar7;
          } while (lVar8 < vStates->nSize);
        }
        p_01->nSize = 0;
        iVar1 = pAig->nTruePos;
        if (iCexPo < 0) {
          if (0 < iVar1) {
            lVar8 = 0;
            do {
              if (pAig->vCos->nSize <= lVar8) goto LAB_00835183;
              Vec_IntPush(p_01,p->pVarNums[*(int *)((long)pAig->vCos->pArray[lVar8] + 0x24)] * 2);
              lVar8 = lVar8 + 1;
            } while (lVar8 < pAig->nTruePos);
          }
        }
        else if (0 < iVar1) {
          uVar10 = 0;
          do {
            if ((long)pAig->vCos->nSize <= (long)uVar10) goto LAB_00835183;
            if ((uint)iCexPo == uVar10) {
              Vec_IntPush(p_01,p->pVarNums[*(int *)((long)pAig->vCos->pArray[(uint)iCexPo] + 0x24)]
                               * 2);
              iVar1 = pAig->nTruePos;
            }
            uVar10 = uVar10 + 1;
          } while ((long)uVar10 < (long)iVar1);
        }
        piVar5 = p_01->pArray;
        iVar1 = sat_solver_addclause(s,piVar5,piVar5 + p_01->nSize);
        if (iVar1 == 0) {
          puts("Llb4_Nonlin4TransformCex(): The SAT solver is unsat after adding last clause.");
LAB_00835001:
          if (piVar5 != (lit *)0x0) {
            free(piVar5);
          }
          free(p_01);
          sat_solver_delete(s);
          Cnf_DataFree(p);
        }
        else {
          p_01->nSize = 0;
          uVar10 = 0;
          if (0 < pAig->nRegs) {
            do {
              uVar3 = (uint)uVar10;
              uVar4 = pAig->nTruePis + uVar3;
              if (((int)uVar4 < 0) || (pAig->vCis->nSize <= (int)uVar4)) goto LAB_00835183;
              Vec_IntPush(p_01,(uint)((*(uint *)((long)pvVar7 + (uVar10 >> 5) * 4) >> (uVar3 & 0x1f)
                                      & 1) == 0) +
                               p->pVarNums[*(int *)((long)pAig->vCis->pArray[uVar4] + 0x24)] * 2);
              uVar10 = (ulong)(uVar3 + 1);
            } while ((int)(uVar3 + 1) < pAig->nRegs);
            piVar5 = p_01->pArray;
            uVar10 = (ulong)p_01->nSize;
          }
          iVar1 = sat_solver_solve(s,piVar5,piVar5 + uVar10,0,0,0,0);
          if (iVar1 == 1) {
            iVar1 = pAig->nTruePis;
            if (0 < iVar1) {
              lVar8 = 0;
              do {
                if (pAig->vCis->nSize <= lVar8) goto LAB_00835183;
                iVar1 = sat_solver_var_value
                                  (s,p->pVarNums[*(int *)((long)pAig->vCis->pArray[lVar8] + 0x24)]);
                if (iVar1 != 0) {
                  iVar1 = local_50 + (int)lVar8;
                  (&p_00[1].iPo)[iVar1 >> 5] =
                       (&p_00[1].iPo)[iVar1 >> 5] | 1 << ((byte)iVar1 & 0x1f);
                }
                lVar8 = lVar8 + 1;
                iVar1 = pAig->nTruePis;
              } while (lVar8 < iVar1);
            }
            if (iVar1 + local_50 != p_00->nBits) {
              __assert_fail("iBit == pCex->nBits",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb4Cex.c"
                            ,0xab,
                            "Abc_Cex_t *Llb4_Nonlin4TransformCex(Aig_Man_t *, Vec_Ptr_t *, int, int)"
                           );
            }
            if (piVar5 != (lit *)0x0) {
              free(piVar5);
            }
            free(p_01);
            sat_solver_delete(s);
            Cnf_DataFree(p);
            iVar1 = Saig_ManFindFailedPoCex(pAig,p_00);
            if ((-1 < iVar1) && (iVar1 < pAig->nTruePos)) {
              p_00->iPo = iVar1;
              return p_00;
            }
            puts("Llb4_Nonlin4TransformCex(): Counter-example verification has FAILED.");
          }
          else {
            puts(
                "Llb4_Nonlin4TransformCex(): There is no last transition that makes the property fail."
                );
            if (piVar5 != (lit *)0x0) {
              free(piVar5);
            }
            free(p_01);
            sat_solver_delete(s);
            Cnf_DataFree(p);
          }
        }
        free(p_00);
        return (Abc_Cex_t *)0x0;
      }
LAB_00835183:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    puts("Llb4_Nonlin4TransformCex(): SAT solver is invalid.");
    sat_solver_delete(s);
  }
  Cnf_DataFree(p);
  return (Abc_Cex_t *)0x0;
}

Assistant:

ABC_NAMESPACE_IMPL_START
 

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Translates a sequence of states into a counter-example.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Cex_t * Llb4_Nonlin4TransformCex( Aig_Man_t * pAig, Vec_Ptr_t * vStates, int iCexPo, int fVerbose )
{
    Abc_Cex_t * pCex;
    Cnf_Dat_t * pCnf;
    Vec_Int_t * vAssumps;
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    unsigned * pNext, * pThis;
    int i, k, iBit, status, nRegs;//, clk = Abc_Clock();
/*
    Vec_PtrForEachEntry( unsigned *, vStates, pNext, i )
    {
        printf( "%4d : ", i );
        Extra_PrintBinary( stdout, pNext, Aig_ManRegNum(pAig) );
        printf( "\n" );
    }
*/
    // derive SAT solver
    nRegs = Aig_ManRegNum(pAig); pAig->nRegs = 0;
    pCnf = Cnf_Derive( pAig, Aig_ManCoNum(pAig) );
    pAig->nRegs = nRegs;
//    Cnf_DataTranformPolarity( pCnf, 0 );
    // convert into SAT solver
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    if ( pSat == NULL )
    {
        printf( "Llb4_Nonlin4TransformCex(): Counter-example generation has failed.\n" );
        Cnf_DataFree( pCnf );
        return NULL;
    }
    // simplify the problem
    status = sat_solver_simplify(pSat);
    if ( status == 0 )
    {
        printf( "Llb4_Nonlin4TransformCex(): SAT solver is invalid.\n" );
        sat_solver_delete( pSat );
        Cnf_DataFree( pCnf );
        return NULL;
    }
    // start the counter-example
    pCex = Abc_CexAlloc( Saig_ManRegNum(pAig), Saig_ManPiNum(pAig), Vec_PtrSize(vStates) );
    pCex->iFrame = Vec_PtrSize(vStates)-1;
    pCex->iPo = -1;

    // solve each time frame
    iBit = Saig_ManRegNum(pAig);
    pThis = (unsigned *)Vec_PtrEntry( vStates, 0 );
    vAssumps = Vec_IntAlloc( 2 * Aig_ManRegNum(pAig) );
    Vec_PtrForEachEntryStart( unsigned *, vStates, pNext, i, 1 )
    {
        // create assumptions
        Vec_IntClear( vAssumps );
        Saig_ManForEachLo( pAig, pObj, k )
            Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], !Abc_InfoHasBit(pThis,k) ) );
        Saig_ManForEachLi( pAig, pObj, k )
            Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], !Abc_InfoHasBit(pNext,k) ) );
        // solve SAT problem
        status = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
            (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        // if the problem is SAT, get the counterexample
        if ( status != l_True )
        {
            printf( "Llb4_Nonlin4TransformCex(): There is no transition between state %d and %d.\n", i-1, i );
            Vec_IntFree( vAssumps );
            sat_solver_delete( pSat );
            Cnf_DataFree( pCnf );
            ABC_FREE( pCex );
            return NULL;
        }
        // get the assignment of PIs
        Saig_ManForEachPi( pAig, pObj, k )
            if ( sat_solver_var_value(pSat, pCnf->pVarNums[Aig_ObjId(pObj)]) )
                Abc_InfoSetBit( pCex->pData, iBit + k );
        // update the counter
        iBit += Saig_ManPiNum(pAig);
        pThis = pNext;
    }

    // add the last frame when the property fails
    Vec_IntClear( vAssumps );
    if ( iCexPo >= 0 )
    {
        Saig_ManForEachPo( pAig, pObj, k )
            if ( k == iCexPo )
                Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 0 ) );
    }
    else
    {
        Saig_ManForEachPo( pAig, pObj, k )
            Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 0 ) );
    }

    // add clause
    status = sat_solver_addclause( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps) );
    if ( status == 0 )
    {
        printf( "Llb4_Nonlin4TransformCex(): The SAT solver is unsat after adding last clause.\n" );
        Vec_IntFree( vAssumps );
        sat_solver_delete( pSat );
        Cnf_DataFree( pCnf );
        ABC_FREE( pCex );
        return NULL;
    }
    // create assumptions
    Vec_IntClear( vAssumps );
    Saig_ManForEachLo( pAig, pObj, k )
        Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], !Abc_InfoHasBit(pThis,k) ) );
    // solve the last frame
    status = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
        (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( status != l_True )
    {
        printf( "Llb4_Nonlin4TransformCex(): There is no last transition that makes the property fail.\n" );
        Vec_IntFree( vAssumps );
        sat_solver_delete( pSat );
        Cnf_DataFree( pCnf );
        ABC_FREE( pCex );
        return NULL;
    }
    // get the assignment of PIs
    Saig_ManForEachPi( pAig, pObj, k )
        if ( sat_solver_var_value(pSat, pCnf->pVarNums[Aig_ObjId(pObj)]) )
            Abc_InfoSetBit( pCex->pData, iBit + k );
    iBit += Saig_ManPiNum(pAig);
    assert( iBit == pCex->nBits );

    // free the sat_solver
    Vec_IntFree( vAssumps );
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );

    // verify counter-example
    status = Saig_ManFindFailedPoCex( pAig, pCex );
    if ( status >= 0 && status < Saig_ManPoNum(pAig) )
        pCex->iPo = status;
    else
    {
        printf( "Llb4_Nonlin4TransformCex(): Counter-example verification has FAILED.\n" );
        ABC_FREE( pCex );
        return NULL;
    }
    // report the results
//    if ( fVerbose )
//       Abc_PrintTime( 1, "SAT-based cex generation time", Abc_Clock() - clk );
    return pCex;
}